

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSatOld.c
# Opt level: O0

void Cbs0_ManAssign(Cbs0_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pObjR;
  Gia_Obj_t *pObj_local;
  Cbs0_Man_t *p_local;
  
  pObj_00 = Gia_Regular(pObj);
  iVar1 = Gia_ObjIsCand(pObj_00);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsCand(pObjR)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSatOld.c"
                  ,0x1bf,"void Cbs0_ManAssign(Cbs0_Man_t *, Gia_Obj_t *)");
  }
  iVar1 = Cbs0_VarIsAssigned(pObj_00);
  if (iVar1 == 0) {
    Cbs0_VarAssign(pObj_00);
    iVar1 = Gia_IsComplement(pObj);
    Cbs0_VarSetValue(pObj_00,(uint)((iVar1 != 0 ^ 0xffU) & 1));
    Cbs0_QuePush(&p->pProp,pObj_00);
    return;
  }
  __assert_fail("!Cbs0_VarIsAssigned(pObjR)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSatOld.c"
                ,0x1c0,"void Cbs0_ManAssign(Cbs0_Man_t *, Gia_Obj_t *)");
}

Assistant:

static inline void Cbs0_ManAssign( Cbs0_Man_t * p, Gia_Obj_t * pObj )
{
    Gia_Obj_t * pObjR = Gia_Regular(pObj);
    assert( Gia_ObjIsCand(pObjR) );
    assert( !Cbs0_VarIsAssigned(pObjR) );
    Cbs0_VarAssign( pObjR );
    Cbs0_VarSetValue( pObjR, !Gia_IsComplement(pObj) );
    Cbs0_QuePush( &p->pProp, pObjR );
}